

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

int __thiscall
NULLCFile::FileReadArr(NULLCFile *this,NULLCArray arr,uint offset,uint count,File *file)

{
  long lVar1;
  size_t sVar2;
  undefined4 in_register_00000084;
  int local_3c;
  File *file_local;
  uint count_local;
  uint offset_local;
  NULLCArray arr_local;
  
  lVar1 = CONCAT44(in_register_00000084,count);
  if (lVar1 == 0) {
    nullcThrowError("ERROR: null pointer access");
    arr_local.ptr._4_4_ = 0;
  }
  else if (*(long *)(lVar1 + 4) == 0) {
    nullcThrowError("Cannot read from a closed file.");
    arr_local.ptr._4_4_ = 0;
  }
  else if ((ulong)(uint)arr.ptr < (ulong)offset + (ulong)arr.len) {
    nullcThrowError("Array can\'t hold %d bytes from the specified offset.",(ulong)offset);
    arr_local.ptr._4_4_ = 0;
  }
  else {
    if (this == (NULLCFile *)0x0) {
      local_3c = 0;
    }
    else {
      sVar2 = fread(this + arr.len,1,(ulong)offset,*(FILE **)(lVar1 + 4));
      local_3c = (int)sVar2;
    }
    arr_local.ptr._4_4_ = local_3c;
  }
  return arr_local.ptr._4_4_;
}

Assistant:

int FileReadArr(NULLCArray arr, unsigned offset, unsigned count, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot read from a closed file.");
			return 0;
		}

		if((long long)count + offset > arr.len)
		{
			nullcThrowError("Array can't hold %d bytes from the specified offset.", count);
			return 0;
		}

		return arr.ptr ? int(fread(arr.ptr + offset, 1, count, file->handle)) : 0;
	}